

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpip-forward.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  int __fd;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  ssize_t sVar11;
  long lVar12;
  byte bVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  sockaddr_in sin;
  timeval tv;
  fd_set fds;
  char buf [16384];
  sockaddr local_40e8;
  long local_40d8;
  ulong local_40d0;
  timeval local_40c8;
  fd_set local_40b8;
  undefined1 local_4038 [16392];
  
  if (1 < argc) {
    server_ip = argv[1];
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    remote_listenhost = argv[4];
  }
  if (5 < argc) {
    remote_wantport = atoi(argv[5]);
  }
  if (6 < argc) {
    local_destip = argv[6];
  }
  if (7 < argc) {
    local_destport = atoi(argv[7]);
  }
  uVar1 = libssh2_init(0);
  if (uVar1 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar1);
    return 1;
  }
  __fd = socket(2,1,6);
  if (__fd == -1) {
    main_cold_18();
LAB_001016e3:
    lVar5 = 0;
LAB_001016ec:
    lVar6 = 0;
  }
  else {
    local_40e8.sa_family = 2;
    local_40e8.sa_data._2_4_ = inet_addr(server_ip);
    if (local_40e8.sa_data._2_4_ == 0xffffffff) {
      main_cold_17();
      goto LAB_001016e3;
    }
    local_40e8.sa_data[0] = '\0';
    local_40e8.sa_data[1] = '\x16';
    iVar2 = connect(__fd,&local_40e8,0x10);
    if (iVar2 != 0) {
      main_cold_1();
      goto LAB_001016e3;
    }
    lVar5 = libssh2_session_init_ex(0,0,0,0);
    if (lVar5 == 0) {
      main_cold_16();
      goto LAB_001016e3;
    }
    uVar1 = libssh2_session_handshake(lVar5,__fd);
    if (uVar1 == 0) {
      lVar6 = libssh2_hostkey_hash(lVar5,2);
      fwrite("Fingerprint: ",0xd,1,_stderr);
      lVar14 = 0;
      do {
        fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar6 + lVar14));
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x14);
      fputc(10,_stderr);
      pcVar8 = username;
      sVar7 = strlen(username);
      pcVar8 = (char *)libssh2_userauth_list(lVar5,pcVar8,sVar7 & 0xffffffff);
      if (pcVar8 == (char *)0x0) {
LAB_0010182f:
        fprintf(_stderr,"Asking server to listen on remote %s:%d\n",remote_listenhost,
                (ulong)(uint)remote_wantport);
        lVar6 = libssh2_channel_forward_listen_ex
                          (lVar5,remote_listenhost,remote_wantport,&remote_listenport,1);
        if (lVar6 != 0) {
          fprintf(_stderr,"Server is listening on %s:%d\n",remote_listenhost,
                  (ulong)(uint)remote_listenport);
          fwrite("Waiting for remote connection\n",0x1e,1,_stderr);
          lVar14 = libssh2_channel_forward_accept(lVar6);
          if (lVar14 != 0) {
            fprintf(_stderr,"Accepted remote connection. Connecting to local server %s:%d\n",
                    local_destip,(ulong)(uint)local_destport);
            iVar2 = socket(2,1,6);
            if (iVar2 == -1) {
              main_cold_13();
              iVar2 = -1;
            }
            else {
              local_40e8.sa_family = 2;
              local_40e8.sa_data._0_2_ = (ushort)local_destport << 8 | (ushort)local_destport >> 8;
              local_40e8.sa_data._2_4_ = inet_addr(local_destip);
              if (local_40e8.sa_data._2_4_ == 0xffffffff) {
                main_cold_12();
              }
              else {
                iVar3 = connect(iVar2,&local_40e8,0x10);
                if (iVar3 == -1) {
                  main_cold_11();
                }
                else {
                  fprintf(_stderr,"Forwarding connection from remote %s:%d to local %s:%d\n",
                          remote_listenhost,(ulong)(uint)remote_listenport,local_destip,
                          (ulong)(uint)local_destport);
                  libssh2_session_set_blocking(lVar5,0);
                  iVar3 = iVar2 + 0x3f;
                  if (-1 < iVar2) {
                    iVar3 = iVar2;
                  }
                  local_40d0 = 1L << ((byte)iVar2 & 0x3f);
                  local_40d8 = (long)(iVar3 >> 6);
                  do {
                    local_40b8.fds_bits[0xe] = 0;
                    local_40b8.fds_bits[0xf] = 0;
                    local_40b8.fds_bits[0xc] = 0;
                    local_40b8.fds_bits[0xd] = 0;
                    local_40b8.fds_bits[10] = 0;
                    local_40b8.fds_bits[0xb] = 0;
                    local_40b8.fds_bits[8] = 0;
                    local_40b8.fds_bits[9] = 0;
                    local_40b8.fds_bits[6] = 0;
                    local_40b8.fds_bits[7] = 0;
                    local_40b8.fds_bits[4] = 0;
                    local_40b8.fds_bits[5] = 0;
                    local_40b8.fds_bits[2] = 0;
                    local_40b8.fds_bits[3] = 0;
                    local_40b8.fds_bits[0] = 0;
                    local_40b8.fds_bits[1] = 0;
                    local_40b8.fds_bits[local_40d8] = local_40b8.fds_bits[local_40d8] | local_40d0;
                    local_40c8.tv_sec = 0;
                    local_40c8.tv_usec = 100000;
                    iVar3 = select(iVar2 + 1,&local_40b8,(fd_set *)0x0,(fd_set *)0x0,&local_40c8);
                    if (iVar3 == 0) {
LAB_00101cf3:
                      do {
                        lVar15 = libssh2_channel_read_ex(lVar14,0,local_4038,0x4000);
                        iVar3 = 0xf;
                        if (lVar15 != -0x25) {
                          if (lVar15 < 0) {
                            fprintf(_stderr,"libssh2_channel_read: %ld",lVar15);
                          }
                          else {
                            if (lVar15 != 0) {
                              lVar12 = 0;
                              do {
                                sVar11 = send(iVar2,local_4038 + lVar12,lVar15 - lVar12,0);
                                if (sVar11 < 1) {
                                  main_cold_9();
                                  iVar3 = 2;
                                  goto LAB_00101d60;
                                }
                                lVar12 = lVar12 + sVar11;
                              } while (lVar12 < lVar15);
                            }
                            iVar4 = libssh2_channel_eof(lVar14);
                            iVar3 = 0;
                            if (iVar4 == 0) goto LAB_00101d60;
                            main_cold_10();
                          }
                          iVar3 = 2;
                        }
LAB_00101d60:
                      } while (iVar3 == 0);
                      if (iVar3 == 0xf) {
                        iVar3 = 0;
                      }
                    }
                    else if (iVar3 == -1) {
                      main_cold_6();
                      iVar3 = 2;
                    }
                    else {
                      if ((local_40b8.fds_bits[local_40d8] & local_40d0) == 0) goto LAB_00101cf3;
                      sVar11 = recv(iVar2,local_4038,0x4000,0);
                      if (sVar11 < 0) {
                        main_cold_8();
LAB_00101c81:
                        iVar3 = 2;
                        bVar16 = false;
                      }
                      else {
                        if (sVar11 == 0) {
                          main_cold_7();
                          goto LAB_00101c81;
                        }
                        lVar15 = 0;
                        while (lVar12 = libssh2_channel_write_ex(lVar14,0,local_4038), -1 < lVar12)
                        {
                          iVar3 = 0;
                          bVar16 = true;
                          if ((lVar12 == 0) || (lVar15 = lVar15 + lVar12, sVar11 <= lVar15))
                          goto LAB_00101cac;
                        }
                        fprintf(_stderr,"libssh2_channel_write: %ld\n",lVar12);
                        bVar16 = false;
                        iVar3 = 2;
                      }
LAB_00101cac:
                      if (bVar16) goto LAB_00101cf3;
                    }
                  } while (iVar3 == 0);
                  if (iVar3 != 2) {
                    return 0;
                  }
                }
              }
            }
            goto LAB_001016f2;
          }
          main_cold_14();
          goto LAB_001016ef;
        }
        main_cold_15();
      }
      else {
        fprintf(_stderr,"Authentication methods: %s\n",pcVar8);
        pcVar9 = strstr(pcVar8,"password");
        bVar16 = pcVar9 != (char *)0x0;
        pcVar8 = strstr(pcVar8,"publickey");
        bVar13 = bVar16 + 2;
        if (pcVar8 == (char *)0x0) {
          bVar13 = bVar16;
        }
        if (8 < argc) {
          if (pcVar9 != (char *)0x0) {
            iVar2 = strcmp(argv[8],"-p");
            if (iVar2 == 0) {
              bVar13 = 0;
              bVar16 = true;
            }
          }
          if ((bVar13 & 2) != 0) {
            iVar2 = strcmp(argv[8],"-k");
            if (iVar2 == 0) {
              bVar13 = 2;
              bVar16 = false;
            }
          }
        }
        pcVar8 = username;
        if (bVar16) {
          sVar7 = strlen(username);
          pcVar9 = password;
          sVar10 = strlen(password);
          iVar2 = libssh2_userauth_password_ex
                            (lVar5,pcVar8,sVar7 & 0xffffffff,pcVar9,sVar10 & 0xffffffff,0);
          if (iVar2 == 0) goto LAB_0010182f;
          main_cold_2();
        }
        else if ((bVar13 & 2) == 0) {
          main_cold_5();
        }
        else {
          sVar7 = strlen(username);
          iVar2 = libssh2_userauth_publickey_fromfile_ex
                            (lVar5,pcVar8,sVar7 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                             "/home/username/.ssh/id_rsa",password);
          if (iVar2 == 0) {
            main_cold_4();
            goto LAB_0010182f;
          }
          main_cold_3();
        }
      }
      goto LAB_001016ec;
    }
    lVar6 = 0;
    fprintf(_stderr,"Error when starting up SSH session: %d\n",(ulong)uVar1);
  }
LAB_001016ef:
  iVar2 = -1;
  lVar14 = 0;
LAB_001016f2:
  if (iVar2 != -1) {
    shutdown(iVar2,2);
    close(iVar2);
  }
  if (lVar14 != 0) {
    libssh2_channel_free(lVar14);
  }
  if (lVar6 != 0) {
    libssh2_channel_forward_cancel(lVar6);
  }
  if (lVar5 != 0) {
    libssh2_session_disconnect_ex(lVar5,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar5);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    int i, auth = AUTH_NONE;
    struct sockaddr_in sin;
    socklen_t sinlen = sizeof(sin);
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_LISTENER *listener = NULL;
    LIBSSH2_CHANNEL *channel = NULL;
    struct timeval tv;
    ssize_t len, wr;
    char buf[16384];
    libssh2_socket_t sock;
    libssh2_socket_t forwardsock = LIBSSH2_INVALID_SOCKET;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1)
        server_ip = argv[1];
    if(argc > 2)
        username = argv[2];
    if(argc > 3)
        password = argv[3];
    if(argc > 4)
        remote_listenhost = argv[4];
    if(argc > 5)
        remote_wantport = atoi(argv[5]);
    if(argc > 6)
        local_destip = argv[6];
    if(argc > 7)
        local_destport = atoi(argv[7]);

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /* Connect to SSH server */
    sock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_addr.s_addr = inet_addr(server_ip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "inet_addr: Invalid IP address '%s'\n", server_ip);
        goto shutdown;
    }
    sin.sin_port = htons(22);
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "Failed to connect to %s.\n", inet_ntoa(sin.sin_addr));
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Error when starting up SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++)
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password"))
            auth |= AUTH_PASSWORD;
        if(strstr(userauthlist, "publickey"))
            auth |= AUTH_PUBLICKEY;

        /* check for options */
        if(argc > 8) {
            if((auth & AUTH_PASSWORD) && !strcmp(argv[8], "-p"))
                auth = AUTH_PASSWORD;
            if((auth & AUTH_PUBLICKEY) && !strcmp(argv[8], "-k"))
                auth = AUTH_PUBLICKEY;
        }

        if(auth & AUTH_PASSWORD) {
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed.\n");
                goto shutdown;
            }
        }
        else if(auth & AUTH_PUBLICKEY) {
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed.\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found.\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "Asking server to listen on remote %s:%d\n",
            remote_listenhost, remote_wantport);

    listener = libssh2_channel_forward_listen_ex(session, remote_listenhost,
                                                 remote_wantport,
                                                 &remote_listenport, 1);
    if(!listener) {
        fprintf(stderr, "Could not start the tcpip-forward listener.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr, "Server is listening on %s:%d\n", remote_listenhost,
            remote_listenport);

    fprintf(stderr, "Waiting for remote connection\n");
    channel = libssh2_channel_forward_accept(listener);
    if(!channel) {
        fprintf(stderr, "Could not accept connection.\n"
                        "(Note that this can be a problem at the server."
                        " Please review the server logs.)\n");
        goto shutdown;
    }

    fprintf(stderr,
            "Accepted remote connection. Connecting to local server %s:%d\n",
            local_destip, local_destport);
    forwardsock = socket(PF_INET, SOCK_STREAM, IPPROTO_TCP);
    if(forwardsock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to open forward socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons((unsigned short)local_destport);
    sin.sin_addr.s_addr = inet_addr(local_destip);
    if(INADDR_NONE == sin.sin_addr.s_addr) {
        fprintf(stderr, "failed in inet_addr().\n");
        goto shutdown;
    }
    if(-1 == connect(forwardsock, (struct sockaddr *)&sin, sinlen)) {
        fprintf(stderr, "failed to connect().\n");
        goto shutdown;
    }

    fprintf(stderr, "Forwarding connection from remote %s:%d to local %s:%d\n",
            remote_listenhost, remote_listenport,
            local_destip, local_destport);

    /* Must use non-blocking IO hereafter due to the current libssh2 API */
    libssh2_session_set_blocking(session, 0);

    for(;;) {
        fd_set fds;
        FD_ZERO(&fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        FD_SET(forwardsock, &fds);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
        tv.tv_sec = 0;
        tv.tv_usec = 100000;
        rc = select((int)(forwardsock + 1), &fds, NULL, NULL, &tv);
        if(-1 == rc) {
            fprintf(stderr, "failed to select().\n");
            goto shutdown;
        }
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
        if(rc && FD_ISSET(forwardsock, &fds)) {
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif
            ssize_t nwritten;
            len = recv(forwardsock, buf, sizeof(buf), 0);
            if(len < 0) {
                fprintf(stderr, "failed to recv().\n");
                goto shutdown;
            }
            else if(len == 0) {
                fprintf(stderr, "The local server at %s:%d disconnected.\n",
                        local_destip, local_destport);
                goto shutdown;
            }
            wr = 0;
            do {
                nwritten = libssh2_channel_write(channel, buf, (size_t)len);
                if(nwritten < 0) {
                    fprintf(stderr, "libssh2_channel_write: %ld\n",
                            (long)nwritten);
                    goto shutdown;
                }
                wr += nwritten;
            } while(nwritten > 0 && wr < len);
        }
        for(;;) {
            ssize_t nsent;
            len = libssh2_channel_read(channel, buf, sizeof(buf));
            if(LIBSSH2_ERROR_EAGAIN == len)
                break;
            else if(len < 0) {
                fprintf(stderr, "libssh2_channel_read: %ld",
                        (long)len);
                goto shutdown;
            }
            wr = 0;
            while(wr < len) {
                nsent = send(forwardsock, buf + wr, (size_t)(len - wr), 0);
                if(nsent <= 0) {
                    fprintf(stderr, "failed to send().\n");
                    goto shutdown;
                }
                wr += nsent;
            }
            if(libssh2_channel_eof(channel)) {
                fprintf(stderr, "The remote client at %s:%d disconnected.\n",
                        remote_listenhost, remote_listenport);
                goto shutdown;
            }
        }
    }

shutdown:

    if(forwardsock != LIBSSH2_INVALID_SOCKET) {
        shutdown(forwardsock, 2);
        LIBSSH2_SOCKET_CLOSE(forwardsock);
    }

    if(channel)
        libssh2_channel_free(channel);

    if(listener)
        libssh2_channel_forward_cancel(listener);

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}